

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
GetRawBlockChecked(BlockManager *blockman,CBlockIndex *blockindex)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  string *message;
  undefined8 uVar4;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  FlatFilePos *in_stack_00000020;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000028;
  BlockManager *in_stack_00000030;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  FlatFilePos pos;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  FlatFilePos *in_stack_ffffffffffffff38;
  CBlockIndex *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff5b;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->super_recursive_mutex).super___recursive_mutex_base._M_mutex.__align = 0;
  pcVar2 = (char *)((long)&(in_RDI->super_recursive_mutex).super___recursive_mutex_base._M_mutex + 8
                   );
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2 = (char *)((long)&(in_RDI->super_recursive_mutex).super___recursive_mutex_base._M_mutex +
                   0x10);
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  mutexIn = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff38);
  FlatFilePos::FlatFilePos(in_stack_ffffffffffffff38);
  message = (string *)
            MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)message,mutexIn,(char *)in_RDI,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b);
  CheckBlockDataAvailability
            ((BlockManager *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (CBlockIndex *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             SUB81((ulong)message >> 0x38,0));
  CBlockIndex::GetBlockPos(in_stack_ffffffffffffff40);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff38);
  bVar3 = node::BlockManager::ReadRawBlockFromDisk
                    (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  if (bVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)mutexIn;
    }
  }
  else {
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff80);
    uVar4 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char *)CONCAT44(in_stack_ffffffffffffff84,uVar5),(allocator<char> *)message);
    JSONRPCError(in_stack_ffffffffffffff8c,message);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<uint8_t> GetRawBlockChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    std::vector<uint8_t> data{};
    FlatFilePos pos{};
    {
        LOCK(cs_main);
        CheckBlockDataAvailability(blockman, blockindex, /*check_for_undo=*/false);
        pos = blockindex.GetBlockPos();
    }

    if (!blockman.ReadRawBlockFromDisk(data, pos)) {
        // Block not found on disk. This shouldn't normally happen unless the block was
        // pruned right after we released the lock above.
        throw JSONRPCError(RPC_MISC_ERROR, "Block not found on disk");
    }

    return data;
}